

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O1

int idaLs_AccessLMemBCur
              (void *ida_mem,char *fname,IDAMem *IDA_mem,IDAadjMem *IDAADJ_mem,IDABMem *IDAB_mem,
              IDALsMemB *idalsB_mem)

{
  IDAadjMem pIVar1;
  IDABMemRec *pIVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar3 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    line = 0xa8b;
  }
  else {
    *IDA_mem = (IDAMem)ida_mem;
    if (*(int *)((long)ida_mem + 0x848) == 0) {
      msgfmt = "Illegal attempt to call before calling IDAAdjInit.";
      iVar3 = -0x65;
      error_code = -0x65;
      line = 0xa94;
    }
    else {
      pIVar1 = *(IDAadjMem *)((long)ida_mem + 0x840);
      *IDAADJ_mem = pIVar1;
      pIVar2 = pIVar1->ia_bckpbCrt;
      if (pIVar2 == (IDABMemRec *)0x0) {
        ida_mem = *IDA_mem;
        msgfmt = "Linear solver memory is NULL for the backward integration.";
        iVar3 = -0x66;
        error_code = -0x66;
        line = 0xa9d;
      }
      else {
        *IDAB_mem = pIVar2;
        if ((IDALsMemB)pIVar2->ida_lmem != (IDALsMemB)0x0) {
          *idalsB_mem = (IDALsMemB)pIVar2->ida_lmem;
          return 0;
        }
        ida_mem = *IDA_mem;
        msgfmt = "Linear solver memory is NULL for the backward integration.";
        iVar3 = -0x66;
        error_code = -0x66;
        line = 0xaa6;
      }
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int idaLs_AccessLMemBCur(void* ida_mem, const char* fname, IDAMem* IDA_mem,
                         IDAadjMem* IDAADJ_mem, IDABMem* IDAB_mem,
                         IDALsMemB* idalsB_mem)
{
  /* access IDAMem structure */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  *IDA_mem = (IDAMem)ida_mem;

  /* access IDAadjMem structure */
  if ((*IDA_mem)->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(*IDA_mem, IDALS_NO_ADJ, __LINE__, fname, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  *IDAADJ_mem = (*IDA_mem)->ida_adj_mem;

  /* get current backward problem */
  if ((*IDAADJ_mem)->ia_bckpbCrt == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEMB_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEMB_NULL);
    return (IDALS_LMEMB_NULL);
  }
  *IDAB_mem = (*IDAADJ_mem)->ia_bckpbCrt;

  /* access IDALsMemB structure */
  if ((*IDAB_mem)->ida_lmem == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEMB_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEMB_NULL);
    return (IDALS_LMEMB_NULL);
  }
  *idalsB_mem = (IDALsMemB)((*IDAB_mem)->ida_lmem);

  return (IDALS_SUCCESS);
}